

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

double3 * tinyusdz::geometric_normal
                    (double3 *__return_storage_ptr__,double3 *p0,double3 *p1,double3 *p2)

{
  double3 local_68;
  double3 local_50;
  undefined1 local_38 [8];
  double3 n;
  double3 *p2_local;
  double3 *p1_local;
  double3 *p0_local;
  
  n._M_elems[2] = (double)p2;
  operator-(&local_50,p1,p0);
  operator-(&local_68,(double3 *)n._M_elems[2],p0);
  vcross((double3 *)local_38,&local_50,&local_68);
  vnormalize(__return_storage_ptr__,(double3 *)local_38,2.220446049250313e-16);
  return __return_storage_ptr__;
}

Assistant:

value::double3 geometric_normal(const value::double3 &p0, const value::double3 &p1, const value::double3 &p2)
{
  value::double3 n = vcross(p1 - p0, p2 - p0);

  return vnormalize(n);
}